

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkBorderColor Diligent::BorderColorToVkBorderColor(Float32 *BorderColor)

{
  float fVar1;
  VkBorderColor VVar2;
  string _msg;
  
  fVar1 = (float)*BorderColor;
  if ((((fVar1 == 0.0) && (!NAN(fVar1))) && ((float)BorderColor[1] == 0.0)) &&
     (!NAN((float)BorderColor[1]))) {
    if ((((float)BorderColor[2] == 0.0) && (!NAN((float)BorderColor[2]))) &&
       (((float)BorderColor[3] == 0.0 && (!NAN((float)BorderColor[3]))))) {
      return VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    }
    if ((((float)BorderColor[2] == 0.0) && (!NAN((float)BorderColor[2]))) &&
       (((float)BorderColor[3] == 1.0 && (!NAN((float)BorderColor[3]))))) {
      return VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
    }
  }
  if ((((fVar1 != 1.0) || (NAN(fVar1))) || ((float)BorderColor[1] != 1.0)) ||
     (((NAN((float)BorderColor[1]) || ((float)BorderColor[2] != 1.0)) ||
      ((NAN((float)BorderColor[2]) ||
       (((float)BorderColor[3] != 1.0 || (NAN((float)BorderColor[3]))))))))) {
    FormatString<char[123]>
              (&_msg,(char (*) [123])
                     "Vulkan samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
    VVar2 = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
  }
  else {
    VVar2 = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
  }
  return VVar2;
}

Assistant:

VkBorderColor BorderColorToVkBorderColor(const Float32 BorderColor[])
{
    VkBorderColor vkBorderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    if (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 0)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    else if (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 1)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
    else if (BorderColor[0] == 1 && BorderColor[1] == 1 && BorderColor[2] == 1 && BorderColor[3] == 1)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
    else
    {
        LOG_ERROR_MESSAGE("Vulkan samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors.");
    }

    return vkBorderColor;
}